

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e9210::brotli_context::_emit(brotli_context *this,bool is_last,bool force_flush)

{
  h2o_iovec_t local_40;
  undefined1 local_29;
  size_t sStack_28;
  bool ret;
  size_t out_size;
  uint8_t *output;
  bool force_flush_local;
  brotli_context *pbStack_10;
  bool is_last_local;
  brotli_context *this_local;
  
  output._6_1_ = force_flush;
  output._7_1_ = is_last;
  pbStack_10 = this;
  local_29 = brotli::BrotliCompressor::WriteBrotliData
                       (this->brotli_,is_last,force_flush,&stack0xffffffffffffffd8,
                        (uint8_t **)&out_size);
  if ((bool)local_29) {
    if (sStack_28 != 0) {
      local_40 = h2o_strdup((h2o_mem_pool_t *)0x0,(char *)out_size,sStack_28);
      std::vector<st_h2o_iovec_t,_std::allocator<st_h2o_iovec_t>_>::push_back
                (&this->bufs_,&local_40);
    }
    return;
  }
  __assert_fail("ret",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/handler/compress/brotli.cc"
                ,0x4b,"void (anonymous namespace)::brotli_context::_emit(bool, bool)");
}

Assistant:

void brotli_context::_emit(bool is_last, bool force_flush)
{
    uint8_t *output;
    size_t out_size;
    bool ret = brotli_->WriteBrotliData(is_last, force_flush, &out_size, &output);
    assert(ret);
    (void)ret;
    if (out_size != 0)
        bufs_.push_back(h2o_strdup(NULL, reinterpret_cast<const char *>(output), out_size));
}